

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *opt,
               InputStream *istream)

{
  uint8_t discriminator;
  uchar local_29;
  __shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  TrivialDeserializer<unsigned_char>::deserialize<InputStream>(&local_29,istream);
  if (local_29 == '\0') {
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    __shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&opt->
                 super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  else {
    BuiltinDeserializer<std::shared_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>,void>
    ::make_nonempty<std::shared_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>
              (opt);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize<InputStream>
              ((opt->
               super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }